

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O2

DetectorResult *
ZXing::QRCode::SampleQR
          (DetectorResult *__return_storage_ptr__,BitMatrix *image,FinderPatternSet *fp)

{
  ulong uVar1;
  pointer piVar2;
  pointer piVar3;
  undefined1 auVar4 [12];
  pointer pPVar5;
  undefined1 auVar6 [16];
  value_t val;
  undefined1 auVar7 [16];
  bool bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int width;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  Version *this;
  RegressionLine *pRVar17;
  int iVar18;
  pointer poVar19;
  ulong uVar20;
  int x;
  int y;
  int iVar21;
  ulong uVar22;
  optional<ZXing::PointT<double>_> *poVar23;
  PerspectiveTransform *pPVar24;
  int x_1;
  int i;
  uint uVar25;
  ulong uVar26;
  byte bVar27;
  double dVar29;
  undefined1 auVar28 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  PointF PVar33;
  PointF PVar34;
  PointF estimate;
  PointT<double> PVar35;
  PointT<double> PVar36;
  PointT<double> PVar37;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  PointT<double> local_3a8;
  PointF local_390;
  Matrix<std::optional<ZXing::PointT<double>_>_> apP;
  ROIs rois;
  optional<ZXing::PointT<double>_> brCP;
  vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> hori;
  RegressionLine local_248;
  PointF guessed;
  anon_class_16_2_ef234508 bestGuessAPP;
  DimensionEstimate left;
  DimensionEstimate top;
  anon_class_24_3_a3104783 findInnerCornerOfConcentricPattern;
  anon_class_16_2_7ab91238 projectM2P;
  undefined8 local_190;
  undefined8 uStack_188;
  uint7 uStack_17f;
  RegressionLine tr3;
  RegressionLine tr2;
  RegressionLine bl3;
  RegressionLine bl2;
  PerspectiveTransform mod2Pix;
  
  bVar27 = 0;
  EstimateDimension(&top,image,fp->tl,fp->tr);
  EstimateDimension(&left,image,fp->tl,fp->bl);
  if (top.dim == 0 && left.dim == 0) {
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->_bits)._width = 0;
    (__return_storage_ptr__->_bits)._height = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    return __return_storage_ptr__;
  }
  dVar29 = top.ms;
  iVar10 = top.dim;
  if (top.dim <= left.dim) {
    dVar29 = left.ms;
    iVar10 = left.dim;
  }
  if (top.err < left.err) {
    left.dim = top.dim;
  }
  width = left.dim;
  if (top.err == left.err) {
    width = iVar10;
  }
  if (left.err <= top.err) {
    top.ms = left.ms;
  }
  if (top.err != left.err) {
    dVar29 = top.ms;
  }
  iVar10 = top.dim;
  TraceLine(&bl2,image,(fp->bl).super_PointF,(fp->tl).super_PointF,2);
  TraceLine(&bl3,image,(fp->bl).super_PointF,(fp->tl).super_PointF,3);
  TraceLine(&tr2,image,(fp->tr).super_PointF,(fp->tl).super_PointF,2);
  dVar30 = 0.0;
  TraceLine(&tr3,image,(fp->tr).super_PointF,(fp->tl).super_PointF,3);
  uVar9 = (uint)(dVar29 + 1.0);
  local_3a8.y = -1.0;
  local_3a8.x = -1.0;
  if ((((!NAN(bl2.a)) && (!NAN(tr2.a))) && (!NAN(bl3.a))) && (!NAN(tr3.a))) {
    PVar33 = intersect(&bl2,&tr2);
    PVar34 = intersect(&bl3,&tr3);
    estimate.x = (PVar34.x + PVar33.x) * 0.5;
    dVar29 = (PVar34.y + PVar33.y) * 0.5;
    local_390.y = estimate.x;
    local_3a8 = _DAT_0019baf0;
    if (0x15 < width) {
      estimate.y = dVar29;
      LocateAlignmentPattern(&brCP,(QRCode *)image,(BitMatrix *)(ulong)uVar9,iVar10,estimate);
      auVar28._0_4_ =
           (int)(brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                 super__Optional_payload_base<ZXing::PointT<double>_>._16_4_ << 0x1f) >> 0x1f;
      auVar28._4_4_ =
           (int)(brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                 super__Optional_payload_base<ZXing::PointT<double>_>._16_4_ << 0x1f) >> 0x1f;
      auVar28._8_4_ =
           (int)(brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                 super__Optional_payload_base<ZXing::PointT<double>_>._16_4_ << 0x1f) >> 0x1f;
      auVar28._12_4_ =
           (int)(brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                 super__Optional_payload_base<ZXing::PointT<double>_>._16_4_ << 0x1f) >> 0x1f;
      auVar7._4_4_ = brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                     super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._4_4_;
      auVar7._0_4_ = brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                     super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._0_4_;
      auVar7._8_4_ = brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                     super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._8_4_;
      auVar7._12_4_ =
           brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
           super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._12_4_;
      local_3a8 = (PointT<double>)(auVar28 & auVar7 | ~auVar28 & (undefined1  [16])_DAT_0019baf0);
    }
    dVar30 = local_3a8.y;
    bVar8 = BitMatrix::isIn<double>(image,local_3a8,0);
    if (!bVar8) {
      brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
      super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._0_4_ = (fp->bl).size;
      brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
      super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._4_4_ = (fp->tl).size;
      brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
      super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._8_4_ = (fp->tr).size;
      __l._M_len = 3;
      __l._M_array = (iterator)&brCP;
      iVar10 = std::min<int>(__l);
      brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
      super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._0_4_ = (fp->bl).size;
      brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
      super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._4_4_ = (fp->tl).size;
      brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
      super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._8_4_ = (fp->tr).size;
      __l_00._M_len = 3;
      __l_00._M_array = (iterator)&brCP;
      iVar11 = std::max<int>(__l_00);
      if ((1.1 < (double)iVar11 / (double)iVar10) ||
         (((bVar8 = RegressionLine::isHighRes(&bl2), bVar8 &&
           (bVar8 = RegressionLine::isHighRes(&bl3), bVar8)) &&
          ((bVar8 = RegressionLine::isHighRes(&tr2), bVar8 &&
           (bVar8 = RegressionLine::isHighRes(&tr3), bVar8)))))) {
        local_3a8.y = dVar29;
        local_3a8.x = estimate.x;
      }
    }
  }
  PVar35.x = local_3a8.x;
  auVar4._4_8_ = dVar30;
  auVar4._0_4_ = local_3a8.x._4_4_;
  auVar6._8_4_ = local_3a8.y._0_4_;
  auVar6._0_8_ = auVar4._0_8_ << 0x20;
  auVar6._12_4_ = local_3a8.y._4_4_;
  PVar35.y = auVar6._8_8_;
  bVar8 = BitMatrix::isIn<double>(image,PVar35,0);
  if (bVar8) {
    dVar29 = 3.0;
  }
  else {
    dVar29 = 0.0;
  }
  local_248.b = (fp->bl).super_PointF.x;
  local_248.c = (fp->bl).super_PointF.y;
  local_248._points.
  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(fp->tl).super_PointF.x;
  local_248._points.
  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(fp->tl).super_PointF.y;
  local_248._points.
  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(fp->tr).super_PointF.x;
  local_248._directionInward.x = (fp->tr).super_PointF.y;
  auVar31._0_8_ =
       ((double)local_248._points.
                super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage -
       (double)local_248._points.
               super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start) + local_248.b;
  auVar31._8_8_ =
       (local_248._directionInward.x -
       (double)local_248._points.
               super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish) + local_248.c;
  uVar25 = (uint)bVar8;
  auVar32._0_4_ = (int)(uVar25 << 0x1f) >> 0x1f;
  auVar32._4_4_ = (int)(uVar25 << 0x1f) >> 0x1f;
  auVar32._8_4_ = (int)(uVar25 << 0x1f) >> 0x1f;
  auVar32._12_4_ = (int)(uVar25 << 0x1f) >> 0x1f;
  local_248._32_16_ = ~auVar32 & auVar31 | (undefined1  [16])local_3a8 & auVar32;
  brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
  super__Optional_payload_base<ZXing::PointT<double>_>._16_8_ = (double)width + -3.5;
  brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
  super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._0_4_ = 0;
  brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
  super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._4_4_ = 0x400c0000;
  brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
  super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._8_4_ = 0;
  brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
  super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._12_4_ = 0x400c0000;
  PerspectiveTransform::PerspectiveTransform
            (&mod2Pix,(QuadrilateralF *)&brCP,(QuadrilateralF *)&local_248);
  if (width < 0x2d) {
    SampleGrid(__return_storage_ptr__,image,width,width,&mod2Pix);
  }
  else {
    brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
    super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._0_4_ = 0;
    brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
    super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._4_4_ = 0;
    local_248._points.
    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT62(local_248._points.
                           super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._2_6_,0x100);
    for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
      uVar20 = (ulong)*(byte *)((long)&local_248._points.
                                       super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar16);
      iVar11 = 0;
      for (iVar10 = 5; iVar21 = width + -9, -1 < iVar10; iVar10 = iVar10 + -1) {
        for (; width + -0xb <= iVar21; iVar21 = iVar21 + -1) {
          iVar13 = iVar21;
          iVar18 = iVar10;
          if (uVar20 != 0) {
            iVar13 = iVar10;
            iVar18 = iVar21;
          }
          PVar33.x = (double)iVar13 + 0.5;
          PVar33.y = (double)iVar18 + 0.5;
          PVar33 = PerspectiveTransform::operator()(&mod2Pix,PVar33);
          local_390.y = PVar33.x;
          local_390.x = PVar33.y;
          bVar8 = BitMatrix::isIn<double>(image,PVar33,0);
          iVar18 = -1;
          if (bVar8) {
            bVar8 = BitMatrix::get(image,PVar33);
            iVar18 = (uint)bVar8 + iVar11 * 2;
          }
          iVar11 = iVar18;
        }
      }
      *(int *)((long)&brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                      super__Optional_payload_base<ZXing::PointT<double>_>._M_payload + uVar20 * 4)
           = iVar11;
    }
    this = Version::DecodeVersionInformation
                     (brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                      super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._0_4_,
                      brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                      super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._4_4_);
    if (this != (Version *)0x0) {
      iVar10 = Version::dimension(this);
      uVar12 = iVar10 - width;
      uVar25 = -uVar12;
      if (0 < (int)uVar12) {
        uVar25 = uVar12;
      }
      if (uVar25 < 9) {
        iVar10 = Version::dimension(this);
        if (iVar10 != width) {
          width = Version::dimension(this);
          hori.super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)(fp->tl).super_PointF.x;
          hori.super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)(fp->tl).super_PointF.y;
          hori.super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(fp->tr).super_PointF.x;
          local_248._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)((double)width + -3.5);
          local_248._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x400c000000000000;
          local_248._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x400c000000000000;
          local_248._directionInward.x = 3.5;
          local_248.b = 3.5;
          local_248.a = (double)local_248._points.
                                super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - dVar29;
          local_248._directionInward.y =
               (double)local_248._points.
                       super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - dVar29;
          local_248.c = (value_t_conflict)
                        local_248._points.
                        super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          PerspectiveTransform::PerspectiveTransform
                    ((PerspectiveTransform *)&brCP,(QuadrilateralF *)&local_248,
                     (QuadrilateralF *)&hori);
          poVar23 = &brCP;
          pPVar24 = &mod2Pix;
          for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
            pPVar24->a11 = (poVar23->super__Optional_base<ZXing::PointT<double>,_true,_true>).
                           _M_payload.super__Optional_payload_base<ZXing::PointT<double>_>.
                           _M_payload._M_value.x;
            poVar23 = (optional<ZXing::PointT<double>_> *)
                      ((long)poVar23 + (ulong)bVar27 * -0x10 + 8);
            pPVar24 = (PerspectiveTransform *)((long)pPVar24 + (ulong)bVar27 * -0x10 + 8);
          }
        }
        iVar10 = (int)((ulong)((long)(this->_alignmentPatternCenters).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->_alignmentPatternCenters).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2);
        val.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
        super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.y =
             (double)uStack_188;
        val.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
        super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.x =
             (double)local_190;
        val.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
        super__Optional_payload_base<ZXing::PointT<double>_>._16_8_ = (ulong)uStack_17f << 8;
        Matrix<std::optional<ZXing::PointT<double>_>_>::Matrix(&apP,iVar10,iVar10,val);
        piVar2 = (this->_alignmentPatternCenters).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        piVar3 = (this->_alignmentPatternCenters).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        projectM2P.mod2Pix = &mod2Pix;
        findInnerCornerOfConcentricPattern.image = image;
        findInnerCornerOfConcentricPattern.apP = &apP;
        findInnerCornerOfConcentricPattern.projectM2P = &projectM2P;
        projectM2P.apM = &this->_alignmentPatternCenters;
        SampleQR::anon_class_24_3_a3104783::operator()
                  (&findInnerCornerOfConcentricPattern,0,0,&fp->tl);
        iVar10 = (int)((ulong)((long)piVar2 - (long)piVar3) >> 2);
        uVar25 = iVar10 - 1;
        SampleQR::anon_class_24_3_a3104783::operator()
                  (&findInnerCornerOfConcentricPattern,0,uVar25,&fp->bl);
        SampleQR::anon_class_24_3_a3104783::operator()
                  (&findInnerCornerOfConcentricPattern,uVar25,0,&fp->tr);
        iVar11 = 0;
        if (0 < iVar10) {
          iVar11 = iVar10;
        }
        bestGuessAPP.apP = &apP;
        bestGuessAPP.projectM2P = &projectM2P;
        for (iVar21 = 0; iVar21 != iVar11; iVar21 = iVar21 + 1) {
          local_390.y._0_4_ = 0;
          for (iVar18 = 0; iVar10 != iVar18; iVar18 = iVar18 + 1) {
            if (apP._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[apP._width * iVar21 + iVar18].
                super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                super__Optional_payload_base<ZXing::PointT<double>_>._M_engaged == false) {
              if (local_390.y._0_4_ == 0) {
                poVar19 = apP._data.
                          super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                PVar34 = SampleQR::anon_class_16_2_ef234508::operator()(&bestGuessAPP,iVar18,iVar21)
                ;
                iVar13 = (int)poVar19;
              }
              else {
                poVar19 = apP._data.
                          super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                PVar35 = SampleQR::anon_class_16_2_ef234508::operator()
                                   (&bestGuessAPP,iVar18 + -1,iVar21);
                iVar13 = (int)poVar19;
                local_390.x = PVar35.x;
                PVar36 = SampleQR::anon_class_16_2_ef234508::operator()
                                   (&bestGuessAPP,iVar18,iVar21 + -1);
                PVar37 = SampleQR::anon_class_16_2_ef234508::operator()
                                   (&bestGuessAPP,iVar18 + -1,iVar21 + -1);
                PVar34.y = (PVar35.y + PVar36.y) - PVar37.y;
                PVar34.x = (PVar35.x + PVar36.x) - PVar37.x;
              }
              LocateAlignmentPattern(&brCP,(QRCode *)image,(BitMatrix *)(ulong)uVar9,iVar13,PVar34);
              if (brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                  super__Optional_payload_base<ZXing::PointT<double>_>._M_engaged == true) {
                iVar13 = apP._width * iVar21 + iVar18;
                apP._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar13].
                super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.x =
                     (double)CONCAT44(brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>.
                                      _M_payload.
                                      super__Optional_payload_base<ZXing::PointT<double>_>.
                                      _M_payload._4_4_,
                                      brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>.
                                      _M_payload.
                                      super__Optional_payload_base<ZXing::PointT<double>_>.
                                      _M_payload._0_4_);
                apP._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar13].
                super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.y =
                     (double)CONCAT44(brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>.
                                      _M_payload.
                                      super__Optional_payload_base<ZXing::PointT<double>_>.
                                      _M_payload._12_4_,
                                      brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>.
                                      _M_payload.
                                      super__Optional_payload_base<ZXing::PointT<double>_>.
                                      _M_payload._8_4_);
                apP._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar13].
                super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                super__Optional_payload_base<ZXing::PointT<double>_>._M_engaged = true;
              }
            }
            local_390.y._0_4_ = local_390.y._0_4_ + iVar21;
          }
        }
        iVar21 = uVar25 * 2 + 2;
        for (iVar18 = 0; iVar18 != iVar11; iVar18 = iVar18 + 1) {
          for (iVar13 = 0; iVar13 != iVar10; iVar13 = iVar13 + 1) {
            if (apP._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[apP._width * iVar18 + iVar13].
                super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                super__Optional_payload_base<ZXing::PointT<double>_>._M_engaged == false) {
              hori.
              super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              hori.
              super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              hori.
              super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              rois.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              rois.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              rois.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              uVar20 = 2;
              while (((int)uVar20 < iVar21 &&
                     ((int)((ulong)((long)hori.
                                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)hori.
                                         super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) < 2))) {
                iVar15 = (int)(uVar20 >> 1);
                iVar14 = -iVar15;
                if ((uVar20 & 1) != 0) {
                  iVar14 = iVar15;
                }
                iVar14 = iVar14 + iVar13;
                if (((-1 < iVar14) && (iVar14 < iVar10)) &&
                   (iVar14 = apP._width * iVar18 + iVar14,
                   apP._data.
                   super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar14].
                   super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                   super__Optional_payload_base<ZXing::PointT<double>_>._M_engaged == true)) {
                  std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::
                  push_back(&hori,(value_type *)
                                  (apP._data.
                                   super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + iVar14));
                }
                uVar20 = (ulong)((int)uVar20 + 1);
              }
              uVar20 = 2;
              while (((int)uVar20 < iVar21 &&
                     ((int)((ulong)((long)rois.
                                          super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)rois.
                                         super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) < 2))) {
                iVar15 = (int)(uVar20 >> 1);
                iVar14 = -iVar15;
                if ((uVar20 & 1) != 0) {
                  iVar14 = iVar15;
                }
                iVar14 = iVar14 + iVar18;
                if (((-1 < iVar14) && (iVar14 < iVar10)) &&
                   (iVar15 = iVar14 * apP._width + iVar13,
                   apP._data.
                   super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar15].
                   super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                   super__Optional_payload_base<ZXing::PointT<double>_>._M_engaged == true)) {
                  std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::
                  push_back((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                             *)&rois,(value_type *)
                                     (apP._data.
                                      super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + iVar15));
                }
                uVar20 = (ulong)((int)uVar20 + 1);
              }
              if ((((long)hori.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)hori.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff0U) == 0x20) &&
                 (uVar20 = (long)rois.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)rois.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                                 _M_impl.super__Vector_impl_data._M_start & 0xffffffff0,
                 uVar20 == 0x20)) {
                RegressionLine::RegressionLine<double>
                          ((RegressionLine *)&brCP,
                           *hori.
                            super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                           hori.
                           super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1]);
                iVar15 = (int)uVar20;
                PVar36.x = ((rois.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                             _M_impl.super__Vector_impl_data._M_start)->mod2Pix).a11;
                PVar36.y = ((rois.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                             _M_impl.super__Vector_impl_data._M_start)->mod2Pix).a12;
                RegressionLine::RegressionLine<double>
                          (&local_248,
                           *(PointT<double> *)
                            rois.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl
                            .super__Vector_impl_data._M_start,PVar36);
                local_390 = intersect((RegressionLine *)&brCP,&local_248);
                guessed = local_390;
                std::_Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::
                ~_Vector_base((_Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                               *)&local_248);
                std::_Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::
                ~_Vector_base((_Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                               *)&brCP);
                LocateAlignmentPattern
                          (&brCP,(QRCode *)image,(BitMatrix *)(ulong)uVar9,iVar15,local_390);
                pRVar17 = (RegressionLine *)&guessed;
                if (brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                    super__Optional_payload_base<ZXing::PointT<double>_>._M_engaged != false) {
                  pRVar17 = (RegressionLine *)&brCP;
                }
                iVar15 = apP._width * iVar18 + iVar13;
                pPVar5 = (pRVar17->_points).
                         super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                apP._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar15].
                super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.x =
                     (double)(pRVar17->_points).
                             super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                apP._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar15].
                super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.y =
                     (double)pPVar5;
                apP._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar15].
                super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                super__Optional_payload_base<ZXing::PointT<double>_>._M_engaged = true;
              }
              std::_Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::
              ~_Vector_base((_Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                             *)&rois);
              std::_Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::
              ~_Vector_base(&hori.
                             super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                           );
            }
          }
        }
        if ((apP._data.
             super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(int)((apP._width + 1) * uVar25)].
             super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
             super__Optional_payload_base<ZXing::PointT<double>_>._M_engaged & 1U) != 0) {
          hori.super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)(fp->tl).super_PointF.x;
          hori.super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)(fp->tl).super_PointF.y;
          hori.super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(fp->tr).super_PointF.x;
          local_248._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)((double)width + -3.5);
          local_248._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x400c000000000000;
          local_248._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x400c000000000000;
          local_248._directionInward.x = 3.5;
          local_248.b = 3.5;
          local_248.a = (double)local_248._points.
                                super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + -3.0;
          local_248._directionInward.y =
               (double)local_248._points.
                       super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + -3.0;
          local_248.c = (value_t_conflict)
                        local_248._points.
                        super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          PerspectiveTransform::PerspectiveTransform
                    ((PerspectiveTransform *)&brCP,(QuadrilateralF *)&local_248,
                     (QuadrilateralF *)&hori);
          poVar23 = &brCP;
          pPVar24 = &mod2Pix;
          for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
            pPVar24->a11 = (poVar23->super__Optional_base<ZXing::PointT<double>,_true,_true>).
                           _M_payload.super__Optional_payload_base<ZXing::PointT<double>_>.
                           _M_payload._M_value.x;
            poVar23 = (optional<ZXing::PointT<double>_> *)
                      ((long)poVar23 + (ulong)bVar27 * -0x10 + 8);
            pPVar24 = (PerspectiveTransform *)((long)pPVar24 + (ulong)bVar27 * -0x10 + 8);
          }
        }
        for (iVar21 = 0; iVar21 != iVar11; iVar21 = iVar21 + 1) {
          for (iVar18 = 0; iVar10 != iVar18; iVar18 = iVar18 + 1) {
            if (apP._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[apP._width * iVar21 + iVar18].
                super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                super__Optional_payload_base<ZXing::PointT<double>_>._M_engaged == false) {
              PVar33 = SampleQR::anon_class_16_2_7ab91238::operator()(&projectM2P,iVar18,iVar21);
              iVar13 = apP._width * iVar21 + iVar18;
              apP._data.
              super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar13].
              super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
              super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.x = PVar33.x;
              apP._data.
              super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar13].
              super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
              super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.y = PVar33.y;
              apP._data.
              super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar13].
              super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
              super__Optional_payload_base<ZXing::PointT<double>_>._M_engaged = true;
            }
          }
        }
        rois.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        rois.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        rois.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        uVar20 = 0;
        if (0 < (int)uVar25) {
          uVar20 = (ulong)uVar25;
        }
        local_390.x = (double)(ulong)uVar25;
        uVar1 = 0;
        while (uVar26 = uVar1, uVar26 != uVar20) {
          uVar1 = uVar26 + 1;
          local_390.y = (double)uVar1;
          iVar11 = 0;
          if (uVar26 == 0) {
            iVar11 = -6;
          }
          iVar21 = 0;
          if (uVar26 == iVar10 - 2) {
            iVar21 = 7;
          }
          for (uVar22 = 0; local_390.x != (double)uVar22; uVar22 = uVar22 + 1) {
            piVar2 = (this->_alignmentPatternCenters).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            iVar18 = piVar2[uVar22];
            iVar13 = piVar2[uVar22 + 1];
            brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
            super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._0_4_ = iVar18 + -6;
            if (uVar22 != 0) {
              brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
              super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._0_4_ = iVar18;
            }
            brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
            super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._4_4_ = iVar13 + 7;
            if (iVar10 - 2 != uVar22) {
              brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
              super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._4_4_ = iVar13;
            }
            brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
            super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._8_4_ =
                 piVar2[uVar26] + iVar11;
            brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
            super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._12_4_ =
                 piVar2[uVar1] + iVar21;
            local_248._points.
            super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)((double)iVar18 + 0.5);
            local_248._points.
            super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)((double)piVar2[uVar26] + 0.5);
            local_248._points.
            super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((double)iVar13 + 0.5);
            local_248.c = (double)piVar2[uVar1] + 0.5;
            local_248.a = local_248.c;
            local_248._directionInward.y =
                 (double)local_248._points.
                         super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            iVar18 = (int)uVar26 * apP._width;
            hori.super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)apP._data.
                          super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar18 + (int)uVar22].
                          super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                          super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.x
            ;
            hori.super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pointer)apP._data.
                          super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar18 + (int)uVar22].
                          super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                          super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.y
            ;
            hori.super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)apP._data.
                          super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar18 + (int)uVar22 + 1].
                          super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                          super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.x
            ;
            local_248._directionInward.x =
                 (double)local_248._points.
                         super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            local_248.b = (value_t_conflict)
                          local_248._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            PerspectiveTransform::PerspectiveTransform
                      ((PerspectiveTransform *)
                       &brCP.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                        super__Optional_payload_base<ZXing::PointT<double>_>._M_engaged,
                       (QuadrilateralF *)&local_248,(QuadrilateralF *)&hori);
            std::vector<ZXing::ROI,_std::allocator<ZXing::ROI>_>::emplace_back<ZXing::ROI>
                      (&rois,(ROI *)&brCP);
          }
        }
        SampleGrid(__return_storage_ptr__,image,width,width,&rois);
        std::_Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>::~_Vector_base
                  (&rois.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>);
        std::
        _Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
        ::~_Vector_base(&apP._data.
                         super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                       );
        goto LAB_00190bdd;
      }
    }
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->_bits)._width = 0;
    (__return_storage_ptr__->_bits)._height = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
LAB_00190bdd:
  std::_Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::~_Vector_base
            ((_Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> *)&tr3);
  std::_Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::~_Vector_base
            ((_Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> *)&tr2);
  std::_Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::~_Vector_base
            ((_Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> *)&bl3);
  std::_Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::~_Vector_base
            ((_Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> *)&bl2);
  return __return_storage_ptr__;
}

Assistant:

DetectorResult SampleQR(const BitMatrix& image, const FinderPatternSet& fp)
{
	auto top  = EstimateDimension(image, fp.tl, fp.tr);
	auto left = EstimateDimension(image, fp.tl, fp.bl);

	if (!top.dim && !left.dim)
		return {};

	auto best = top.err == left.err ? (top.dim > left.dim ? top : left) : (top.err < left.err ? top : left);
	int dimension = best.dim;
	int moduleSize = static_cast<int>(best.ms + 1);

	auto br = PointF{-1, -1};
	auto brOffset = PointF{3, 3};

	// Everything except version 1 (21 modules) has an alignment pattern. Estimate the center of that by intersecting
	// line extensions of the 1 module wide square around the finder patterns. This could also help with detecting
	// slanted symbols of version 1.

	// generate 4 lines: outer and inner edge of the 1 module wide black line between the two outer and the inner
	// (tl) finder pattern
	auto bl2 = TraceLine(image, fp.bl, fp.tl, 2);
	auto bl3 = TraceLine(image, fp.bl, fp.tl, 3);
	auto tr2 = TraceLine(image, fp.tr, fp.tl, 2);
	auto tr3 = TraceLine(image, fp.tr, fp.tl, 3);

	if (bl2.isValid() && tr2.isValid() && bl3.isValid() && tr3.isValid()) {
		// intersect both outer and inner line pairs and take the center point between the two intersection points
		auto brInter = (intersect(bl2, tr2) + intersect(bl3, tr3)) / 2;
		log(brInter, 3);

		if (dimension > 21)
			if (auto brCP = LocateAlignmentPattern(image, moduleSize, brInter))
				br = *brCP;

		// if the symbol is tilted or the resolution of the RegressionLines is sufficient, use their intersection
		// as the best estimate (see discussion in #199 and test image estimate-tilt.jpg )
		if (!image.isIn(br) && (EstimateTilt(fp) > 1.1 || (bl2.isHighRes() && bl3.isHighRes() && tr2.isHighRes() && tr3.isHighRes())))
			br = brInter;
	}

	// otherwise the simple estimation used by upstream is used as a best guess fallback
	if (!image.isIn(br)) {
		br = fp.tr - fp.tl + fp.bl;
		brOffset = PointF(0, 0);
	}

	log(br, 3);
	auto mod2Pix = Mod2Pix(dimension, brOffset, {fp.tl, fp.tr, br, fp.bl});

	if( dimension >= Version::SymbolSize(7, Type::Model2).x) {
		auto version = ReadVersion(image, dimension, mod2Pix);

		// if the version bits are garbage -> discard the detection
		if (!version || std::abs(version->dimension() - dimension) > 8)
			return DetectorResult();
		if (version->dimension() != dimension) {
			printf("update dimension: %d -> %d\n", dimension, version->dimension());
			dimension = version->dimension();
			mod2Pix = Mod2Pix(dimension, brOffset, {fp.tl, fp.tr, br, fp.bl});
		}
#if 1
		auto& apM = version->alignmentPatternCenters(); // alignment pattern positions in modules
		auto apP = Matrix<std::optional<PointF>>(Size(apM), Size(apM)); // found/guessed alignment pattern positions in pixels
		const int N = Size(apM) - 1;

		// project the alignment pattern at module coordinates x/y to pixel coordinate based on current mod2Pix
		auto projectM2P = [&mod2Pix, &apM](int x, int y) { return mod2Pix(centered(PointI(apM[x], apM[y]))); };

		auto findInnerCornerOfConcentricPattern = [&image, &apP, &projectM2P](int x, int y, const ConcentricPattern& fp) {
			auto pc = *apP.set(x, y, projectM2P(x, y));
			if (auto fpQuad = FindConcentricPatternCorners(image, fp, fp.size, 2))
				for (auto c : *fpQuad)
					if (distance(c, pc) < fp.size / 2)
						apP.set(x, y, c);
		};

		findInnerCornerOfConcentricPattern(0, 0, fp.tl);
		findInnerCornerOfConcentricPattern(0, N, fp.bl);
		findInnerCornerOfConcentricPattern(N, 0, fp.tr);

		auto bestGuessAPP = [&](int x, int y){
			if (auto p = apP(x, y))
				return *p;
			return projectM2P(x, y);
		};

		for (int y = 0; y <= N; ++y)
			for (int x = 0; x <= N; ++x) {
				if (apP(x, y))
					continue;

				PointF guessed =
					x * y == 0 ? bestGuessAPP(x, y) : bestGuessAPP(x - 1, y) + bestGuessAPP(x, y - 1) - bestGuessAPP(x - 1, y - 1);
				if (auto found = LocateAlignmentPattern(image, moduleSize, guessed))
					apP.set(x, y, *found);
			}

		// go over the whole set of alignment patters again and try to fill any remaining gap by using available neighbors as guides
		for (int y = 0; y <= N; ++y)
			for (int x = 0; x <= N; ++x) {
				if (apP(x, y))
					continue;

				// find the two closest valid alignment pattern pixel positions both horizontally and vertically
				std::vector<PointF> hori, verti;
				for (int i = 2; i < 2 * N + 2 && Size(hori) < 2; ++i) {
					int xi = x + i / 2 * (i%2 ? 1 : -1);
					if (0 <= xi && xi <= N && apP(xi, y))
						hori.push_back(*apP(xi, y));
				}
				for (int i = 2; i < 2 * N + 2 && Size(verti) < 2; ++i) {
					int yi = y + i / 2 * (i%2 ? 1 : -1);
					if (0 <= yi && yi <= N && apP(x, yi))
						verti.push_back(*apP(x, yi));
				}

				// if we found 2 each, intersect the two lines that are formed by connecting the point pairs
				if (Size(hori) == 2 && Size(verti) == 2) {
					auto guessed = intersect(RegressionLine(hori[0], hori[1]), RegressionLine(verti[0], verti[1]));
					auto found = LocateAlignmentPattern(image, moduleSize, guessed);
					// search again near that intersection and if the search fails, use the intersection
					if (!found) printf("location guessed at %dx%d\n", x, y);
					apP.set(x, y, found ? *found : guessed);
				}
			}

		if (auto c = apP.get(N, N))
			mod2Pix = Mod2Pix(dimension, PointF(3, 3), {fp.tl, fp.tr, *c, fp.bl});

		// go over the whole set of alignment patters again and fill any remaining gaps by a projection based on an updated mod2Pix
		// projection. This works if the symbol is flat, wich is a reasonable fall-back assumption.
		for (int y = 0; y <= N; ++y)
			for (int x = 0; x <= N; ++x) {
				if (apP(x, y))
					continue;

				printf("locate failed at %dx%d\n", x, y);
				apP.set(x, y, projectM2P(x, y));
			}

#ifdef PRINT_DEBUG
		for (int y = 0; y <= N; ++y)
			for (int x = 0; x <= N; ++x)
				log(*apP(x, y), 2);
#endif

		// assemble a list of region-of-interests based on the found alignment pattern pixel positions
		ROIs rois;
		for (int y = 0; y < N; ++y)
			for (int x = 0; x < N; ++x) {
				int x0 = apM[x], x1 = apM[x + 1], y0 = apM[y], y1 = apM[y + 1];
				rois.push_back({x0 - (x == 0) * 6, x1 + (x == N - 1) * 7, y0 - (y == 0) * 6, y1 + (y == N - 1) * 7,
								PerspectiveTransform{Rectangle(x0, x1, y0, y1),
													 {*apP(x, y), *apP(x + 1, y), *apP(x + 1, y + 1), *apP(x, y + 1)}}});
			}

		return SampleGrid(image, dimension, dimension, rois);
#endif
	}

	return SampleGrid(image, dimension, dimension, mod2Pix);
}